

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void YUY2ToYRow_C(uint8_t *src_yuy2,uint8_t *dst_y,int width)

{
  long lVar1;
  
  if (1 < width) {
    lVar1 = 0;
    do {
      dst_y[lVar1] = *src_yuy2;
      dst_y[lVar1 + 1] = src_yuy2[2];
      src_yuy2 = src_yuy2 + 4;
      lVar1 = lVar1 + 2;
    } while (lVar1 < (int)((long)width + -1));
  }
  if ((width & 1U) != 0) {
    dst_y[(long)width + -1] = *src_yuy2;
  }
  return;
}

Assistant:

void YUY2ToYRow_C(const uint8_t* src_yuy2, uint8_t* dst_y, int width) {
  // Output a row of Y values.
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_y[x] = src_yuy2[0];
    dst_y[x + 1] = src_yuy2[2];
    src_yuy2 += 4;
  }
  if (width & 1) {
    dst_y[width - 1] = src_yuy2[0];
  }
}